

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O2

Opnd * __thiscall IR::Instr::ReplaceSrc1(Instr *this,Opnd *newSrc)

{
  Opnd *pOVar1;
  
  FreeSrc1(this);
  pOVar1 = SetSrc1(this,newSrc);
  return pOVar1;
}

Assistant:

Opnd *
Instr::ReplaceSrc1(Opnd * newSrc)
{
    this->FreeSrc1();
    return this->SetSrc1(newSrc);
}